

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_with_normal_and_texture.c
# Opt level: O2

void prf_vertex_with_normal_and_texture_fill_vertex(prf_node_t *node,prf_vertex_t *vertex)

{
  float64_t *pfVar1;
  ushort uVar2;
  uint uVar3;
  
  if (node->opcode != prf_vertex_with_normal_and_texture_info.opcode) {
    prf_error(9,"fill vertex with normal and texture from node of type %d");
    return;
  }
  uVar2 = node->length;
  if (uVar2 < 6) {
    uVar3 = 4;
  }
  else {
    pfVar1 = (float64_t *)node->data;
    vertex->color_name_index = *(uint16_t *)(pfVar1 + 3);
    if (uVar2 < 8) {
      uVar3 = 6;
    }
    else {
      vertex->flags = *(uint16_t *)((long)pfVar1 + 0x1a);
      if (uVar2 < 0x10) {
        uVar3 = 8;
      }
      else {
        vertex->x = *pfVar1;
        if (uVar2 < 0x18) {
          uVar3 = 0x10;
        }
        else {
          vertex->y = pfVar1[1];
          if (uVar2 < 0x20) {
            uVar3 = 0x18;
          }
          else {
            vertex->z = pfVar1[2];
            if (uVar2 < 0x24) {
              uVar3 = 0x20;
            }
            else {
              vertex->normal[0] = *(float32_t *)((long)pfVar1 + 0x1c);
              if (uVar2 < 0x28) {
                uVar3 = 0x24;
              }
              else {
                vertex->normal[1] = *(float32_t *)(pfVar1 + 4);
                if (uVar2 < 0x2c) {
                  uVar3 = 0x28;
                }
                else {
                  vertex->normal[2] = *(float32_t *)((long)pfVar1 + 0x24);
                  vertex->has_normal = 1;
                  if (uVar2 < 0x30) {
                    uVar3 = 0x2c;
                  }
                  else {
                    vertex->texture[0] = *(float32_t *)(pfVar1 + 5);
                    if (uVar2 < 0x34) {
                      uVar3 = 0x30;
                    }
                    else {
                      vertex->texture[1] = *(float32_t *)((long)pfVar1 + 0x2c);
                      vertex->has_texture = 1;
                      if (0x37 < uVar2) {
                        vertex->packed_color = *(uint32_t *)(pfVar1 + 6);
                        if (uVar2 < 0x3c) {
                          uVar3 = 0x38;
                        }
                        else {
                          vertex->color_index = *(uint32_t *)((long)pfVar1 + 0x34);
                          uVar3 = 0x3c;
                        }
                        goto LAB_0010a8b4;
                      }
                      uVar3 = 0x34;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  prf_warn(1,"stores only %d bytes in vertex with normal and texture",uVar3);
  uVar2 = node->length;
LAB_0010a8b4:
  if (uVar2 <= uVar3) {
    return;
  }
  prf_warn(1,"vertex with normal and texture is larger than %d bytes (%d)",(ulong)uVar3);
  return;
}

Assistant:

void
prf_vertex_with_normal_and_texture_fill_vertex(
    prf_node_t * node,
    prf_vertex_t * vertex )
{
    int pos = 4;
    bool_t complete = FALSE;

    assert( node != NULL && vertex != NULL );

    if ( node->opcode != prf_vertex_with_normal_and_texture_info.opcode ) {
        prf_error( 9,
            "fill vertex with normal and texture from node of type %d",
            node->opcode );
        return;
    }

    do {
        node_data * data = (node_data *) node->data;
        if ( node->length < (pos + 2) ) break;
        vertex->color_name_index = data->color_name_index; pos += 2;
        if ( node->length < (pos + 2) ) break;
        vertex->flags = data->flags; pos += 2;
        if ( node->length < (pos + 8) ) break;
        prf_dblcpy( vertex->x, data->x ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblcpy( vertex->y, data->y ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblcpy( vertex->z, data->z ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        vertex->normal[0] = data->normal[0]; pos += 4;
        if ( node->length < (pos + 4) ) break;
        vertex->normal[1] = data->normal[1]; pos += 4;
        if ( node->length < (pos + 4) ) break;
        vertex->normal[2] = data->normal[2]; pos += 4;
        vertex->has_normal = TRUE;
        if ( node->length < (pos + 4) ) break;
        vertex->texture[0] = data->texture[0]; pos += 4;
        if ( node->length < (pos + 4) ) break;
        vertex->texture[1] = data->texture[1]; pos += 4;
        vertex->has_texture = TRUE;
        if ( node->length < (pos + 4) ) break;
        vertex->packed_color = data->packed_color; pos += 4;
        complete = TRUE;
        if ( node->length < (pos + 4) ) break;
        vertex->color_index = data->color_index; pos += 4;
        complete = TRUE;
    } while ( FALSE );

    if ( ! complete )
        prf_warn( 1, "stores only %d bytes in vertex with normal and texture",
            pos );
    /* padding can't be dealt with, but should be notified, though  */
    if ( pos < node->length )
        prf_warn( 1,
            "vertex with normal and texture is larger than %d bytes (%d)",
            pos, node->length );
}